

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::ColoredWriteToStderr(LogSeverity severity,char *message,size_t len)

{
  FILE *__stream;
  bool *pbVar1;
  char *pcVar2;
  size_t in_RDX;
  void *in_RSI;
  LogSeverity in_EDI;
  GLogColor color;
  GLogColor local_20;
  
  pbVar1 = LogDestination::terminal_supports_color();
  if (((*pbVar1 & 1U) == 0) || ((fLB::FLAGS_colorlogtostderr & 1) == 0)) {
    local_20 = COLOR_DEFAULT;
  }
  else {
    local_20 = SeverityToColor(in_EDI);
  }
  __stream = _stderr;
  if (local_20 == COLOR_DEFAULT) {
    fwrite(in_RSI,in_RDX,1,_stderr);
  }
  else {
    pcVar2 = GetAnsiColorCode(local_20);
    fprintf(__stream,"\x1b[0;3%sm",pcVar2);
    fwrite(in_RSI,in_RDX,1,_stderr);
    fprintf(_stderr,"\x1b[m");
  }
  return;
}

Assistant:

static void ColoredWriteToStderr(LogSeverity severity,
                                 const char* message, size_t len) {
  const GLogColor color =
      (LogDestination::terminal_supports_color() && FLAGS_colorlogtostderr) ?
      SeverityToColor(severity) : COLOR_DEFAULT;

  // Avoid using cerr from this module since we may get called during
  // exit code, and cerr may be partially or fully destroyed by then.
  if (COLOR_DEFAULT == color) {
    fwrite(message, len, 1, stderr);
    return;
  }
#ifdef OS_WINDOWS
  const HANDLE stderr_handle = GetStdHandle(STD_ERROR_HANDLE);

  // Gets the current text color.
  CONSOLE_SCREEN_BUFFER_INFO buffer_info;
  GetConsoleScreenBufferInfo(stderr_handle, &buffer_info);
  const WORD old_color_attrs = buffer_info.wAttributes;

  // We need to flush the stream buffers into the console before each
  // SetConsoleTextAttribute call lest it affect the text that is already
  // printed but has not yet reached the console.
  fflush(stderr);
  SetConsoleTextAttribute(stderr_handle,
                          GetColorAttribute(color) | FOREGROUND_INTENSITY);
  fwrite(message, len, 1, stderr);
  fflush(stderr);
  // Restores the text color.
  SetConsoleTextAttribute(stderr_handle, old_color_attrs);
#else
  fprintf(stderr, "\033[0;3%sm", GetAnsiColorCode(color));
  fwrite(message, len, 1, stderr);
  fprintf(stderr, "\033[m");  // Resets the terminal to default.
#endif  // OS_WINDOWS
}